

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::PathArcToFast(ImDrawList *this,ImVec2 *centre,float radius,int amin,int amax)

{
  int iVar1;
  float fVar2;
  ImVec2 *local_68;
  ImVec2 local_58;
  ImVec2 *local_50;
  ImVec2 *c;
  float local_40;
  int a_1;
  float a;
  int i;
  int circle_vtx_count;
  int local_24;
  int local_20;
  int amax_local;
  int amin_local;
  float radius_local;
  ImVec2 *centre_local;
  ImDrawList *this_local;
  
  local_24 = amax;
  local_20 = amin;
  amax_local = (int)radius;
  _amin_local = centre;
  centre_local = (ImVec2 *)this;
  if ((PathArcToFast(ImVec2_const&,float,int,int)::circle_vtx == '\0') &&
     (iVar1 = __cxa_guard_acquire(&PathArcToFast(ImVec2_const&,float,int,int)::circle_vtx),
     iVar1 != 0)) {
    local_68 = PathArcToFast::circle_vtx;
    do {
      ImVec2::ImVec2(local_68);
      local_68 = local_68 + 1;
    } while (local_68 != (ImVec2 *)&PathArcToFast(ImVec2_const&,float,int,int)::circle_vtx);
    __cxa_guard_release(&PathArcToFast(ImVec2_const&,float,int,int)::circle_vtx);
  }
  a = 1.68156e-44;
  if ((PathArcToFast::circle_vtx_builds & 1U) == 0) {
    for (a_1 = 0; a_1 < 0xc; a_1 = a_1 + 1) {
      local_40 = ((float)a_1 / 12.0) * 2.0 * 3.1415927;
      fVar2 = cosf(local_40);
      PathArcToFast::circle_vtx[a_1].x = fVar2;
      fVar2 = sinf(local_40);
      PathArcToFast::circle_vtx[a_1].y = fVar2;
    }
    PathArcToFast::circle_vtx_builds = true;
  }
  if (local_20 <= local_24) {
    if (((float)amax_local != 0.0) || (NAN((float)amax_local))) {
      ImVector<ImVec2>::reserve(&this->_Path,(this->_Path).Size + (local_24 - local_20) + 1);
      for (c._4_4_ = local_20; c._4_4_ <= local_24; c._4_4_ = c._4_4_ + 1) {
        local_50 = PathArcToFast::circle_vtx + c._4_4_ % 0xc;
        ImVec2::ImVec2(&local_58,local_50->x * (float)amax_local + _amin_local->x,
                       PathArcToFast::circle_vtx[c._4_4_ % 0xc].y * (float)amax_local +
                       _amin_local->y);
        ImVector<ImVec2>::push_back(&this->_Path,&local_58);
      }
    }
    else {
      ImVector<ImVec2>::push_back(&this->_Path,_amin_local);
    }
  }
  return;
}

Assistant:

void ImDrawList::PathArcToFast(const ImVec2& centre, float radius, int amin, int amax)
{
    static ImVec2 circle_vtx[12];
    static bool circle_vtx_builds = false;
    const int circle_vtx_count = IM_ARRAYSIZE(circle_vtx);
    if (!circle_vtx_builds)
    {
        for (int i = 0; i < circle_vtx_count; i++)
        {
            const float a = ((float)i / (float)circle_vtx_count) * 2*IM_PI;
            circle_vtx[i].x = cosf(a);
            circle_vtx[i].y = sinf(a);
        }
        circle_vtx_builds = true;
    }

    if (amin > amax) return;
    if (radius == 0.0f)
    {
        _Path.push_back(centre);
    }
    else
    {
        _Path.reserve(_Path.Size + (amax - amin + 1));
        for (int a = amin; a <= amax; a++)
        {
            const ImVec2& c = circle_vtx[a % circle_vtx_count];
            _Path.push_back(ImVec2(centre.x + c.x * radius, centre.y + c.y * radius));
        }
    }
}